

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSimulationIslandManager.cpp
# Opt level: O3

void __thiscall
cbtSimulationIslandManager::storeIslandActivationState
          (cbtSimulationIslandManager *this,cbtCollisionWorld *colWorld)

{
  cbtElement *pcVar1;
  cbtCollisionObject **ppcVar2;
  cbtElement *pcVar3;
  cbtCollisionObject *pcVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  cbtElement *pcVar10;
  
  lVar5 = (long)(colWorld->m_collisionObjects).m_size;
  if (0 < lVar5) {
    ppcVar2 = (colWorld->m_collisionObjects).m_data;
    pcVar3 = (this->m_unionFind).m_elements.m_data;
    lVar7 = 0;
    iVar8 = 0;
    do {
      pcVar4 = ppcVar2[lVar7];
      if ((pcVar4->m_collisionFlags & 3) == 0) {
        pcVar1 = pcVar3 + iVar8;
        iVar9 = pcVar1->m_id;
        pcVar10 = pcVar1;
        iVar6 = iVar8;
        if (iVar9 != iVar8) {
          do {
            iVar6 = pcVar3[iVar9].m_id;
            pcVar10->m_id = iVar6;
            iVar9 = pcVar3[iVar6].m_id;
            pcVar10 = pcVar3 + iVar6;
          } while (iVar6 != iVar9);
        }
        pcVar4->m_islandTag1 = iVar6;
        pcVar1->m_sz = (int)lVar7;
        pcVar4->m_companionId = -1;
        iVar8 = iVar8 + 1;
      }
      else {
        pcVar4->m_islandTag1 = -1;
        pcVar4->m_companionId = -2;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar5);
  }
  return;
}

Assistant:

void cbtSimulationIslandManager::storeIslandActivationState(cbtCollisionWorld* colWorld)
{
	// put the islandId ('find' value) into m_tag
	{
		int index = 0;
		int i;
		for (i = 0; i < colWorld->getCollisionObjectArray().size(); i++)
		{
			cbtCollisionObject* collisionObject = colWorld->getCollisionObjectArray()[i];
			if (!collisionObject->isStaticOrKinematicObject())
			{
				collisionObject->setIslandTag(m_unionFind.find(index));
				//Set the correct object offset in Collision Object Array
				m_unionFind.getElement(index).m_sz = i;
				collisionObject->setCompanionId(-1);
				index++;
			}
			else
			{
				collisionObject->setIslandTag(-1);
				collisionObject->setCompanionId(-2);
			}
		}
	}
}